

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_row_push(nk_context *ctx,float ratio_or_width)

{
  nk_panel *pnVar1;
  float local_38;
  float local_34;
  float local_30;
  float ratio;
  nk_panel *layout;
  nk_window *win;
  float ratio_or_width_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4baf,"void nk_layout_row_push(struct nk_context *, float)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4bb0,"void nk_layout_row_push(struct nk_context *, float)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4bb1,"void nk_layout_row_push(struct nk_context *, float)");
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar1 = ctx->current->layout;
    if (((pnVar1->row).type != NK_LAYOUT_STATIC_ROW) &&
       ((pnVar1->row).type != NK_LAYOUT_DYNAMIC_ROW)) {
      __assert_fail("layout->row.type == NK_LAYOUT_STATIC_ROW || layout->row.type == NK_LAYOUT_DYNAMIC_ROW"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x4bb7,"void nk_layout_row_push(struct nk_context *, float)");
    }
    if (((pnVar1->row).type == NK_LAYOUT_STATIC_ROW) ||
       ((pnVar1->row).type == NK_LAYOUT_DYNAMIC_ROW)) {
      if ((pnVar1->row).type == NK_LAYOUT_DYNAMIC_ROW) {
        if (ratio_or_width + (pnVar1->row).filled <= 1.0) {
          if (ratio_or_width <= 0.0) {
            (pnVar1->row).item_width = 1.0 - (pnVar1->row).filled;
          }
          else {
            local_30 = ratio_or_width;
            if (1.0 < ratio_or_width) {
              local_30 = 1.0;
            }
            if (local_30 <= 0.0) {
              local_38 = 0.0;
            }
            else {
              local_34 = ratio_or_width;
              if (1.0 < ratio_or_width) {
                local_34 = 1.0;
              }
              local_38 = local_34;
            }
            (pnVar1->row).item_width = local_38;
          }
        }
      }
      else {
        (pnVar1->row).item_width = ratio_or_width;
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_layout_row_push(struct nk_context *ctx, float ratio_or_width)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    NK_ASSERT(layout->row.type == NK_LAYOUT_STATIC_ROW || layout->row.type == NK_LAYOUT_DYNAMIC_ROW);
    if (layout->row.type != NK_LAYOUT_STATIC_ROW && layout->row.type != NK_LAYOUT_DYNAMIC_ROW)
        return;

    if (layout->row.type == NK_LAYOUT_DYNAMIC_ROW) {
        float ratio = ratio_or_width;
        if ((ratio + layout->row.filled) > 1.0f) return;
        if (ratio > 0.0f)
            layout->row.item_width = NK_SATURATE(ratio);
        else layout->row.item_width = 1.0f - layout->row.filled;
    } else layout->row.item_width = ratio_or_width;
}